

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_plugin.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  string_view name;
  MockCodeGenerator MStack_68;
  
  name._M_str = "test_plugin";
  name._M_len = 0xb;
  google::protobuf::compiler::MockCodeGenerator::MockCodeGenerator(&MStack_68,name);
  iVar1 = google::protobuf::compiler::PluginMain(argc,argv,&MStack_68.super_CodeGenerator);
  google::protobuf::compiler::MockCodeGenerator::~MockCodeGenerator(&MStack_68);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
#ifdef _MSC_VER
  // Don't print a silly message or stick a modal dialog box in my face,
  // please.
  _set_abort_behavior(0, ~0);
#endif  // !_MSC_VER
  return google::protobuf::compiler::ProtobufMain(argc, argv);
}